

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O2

void __thiscall Args::GroupIface::checkCorrectnessAfterParsing(GroupIface *this)

{
  pointer puVar1;
  int iVar2;
  BaseException *this_00;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  pointer puVar3;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  puVar1 = (this->m_children).
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_children).
                super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    (*((puVar3->_M_t).super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>
       ._M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
       super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[0x11])();
  }
  iVar2 = (*(this->super_ArgIface)._vptr_ArgIface[5])(this);
  if ((char)iVar2 != '\0') {
    iVar2 = (*(this->super_ArgIface)._vptr_ArgIface[6])(this);
    if ((char)iVar2 == '\0') {
      this_00 = (BaseException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_80,"Not defined required argument \"",&local_a1)
      ;
      (*(this->super_ArgIface)._vptr_ArgIface[3])(&local_a0,this);
      std::operator+(&local_60,&local_80,&local_a0);
      std::operator+(&local_40,&local_60,"\"");
      BaseException::BaseException(this_00,&local_40);
      __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
    }
  }
  return;
}

Assistant:

void checkCorrectnessAfterParsing() const override
	{
		for( const auto & arg : details::asConst( m_children ) )
			arg->checkCorrectnessAfterParsing();

		if( isRequired() && !isDefined() )
			throw BaseException(
				String( SL( "Not defined required argument \"" ) ) +
				name() + SL( "\"" ) );
	}